

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteLightsLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  size_t a;
  ulong pIndex;
  
  if ((this->mScene->mLights != (aiLight **)0x0) && (this->mScene->mNumLights != 0)) {
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<library_lights>");
    std::operator<<(poVar1,(string *)&this->endstr);
    PushTag(this);
    for (pIndex = 0; pIndex < this->mScene->mNumLights; pIndex = pIndex + 1) {
      WriteLight(this,pIndex);
    }
    PopTag(this);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"</library_lights>");
    std::operator<<(poVar1,(string *)&this->endstr);
    return;
  }
  return;
}

Assistant:

void ColladaExporter::WriteLightsLibrary() {
    if(mScene->HasLights()) {

        mOutput << startstr << "<library_lights>" << endstr;
        PushTag();

        for( size_t a = 0; a < mScene->mNumLights; ++a)
            WriteLight( a);

        PopTag();
        mOutput << startstr << "</library_lights>" << endstr;

    }
}